

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

void __thiscall Assimp::FIBoolDecoder::~FIBoolDecoder(FIBoolDecoder *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len < 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<bool> value;
        uint8_t b = *data++;
        size_t unusedBits = b >> 4;
        size_t numBools = (len * 8) - 4 - unusedBits;
        value.reserve(numBools);
        uint8_t mask = 1 << 3;
        for (size_t i = 0; i < numBools; ++i) {
            if (!mask) {
                mask = 1 << 7;
                b = *data++;
            }
            value.push_back((b & mask) != 0);
        }
        return FIBoolValue::create(std::move(value));
    }